

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

uchar * EmergencyFindTable_UuidHelper
                  (bool bReverseByteOrder,size_t sizeof_chunk_value,uchar *buffer,uchar *buffer_end,
                  ON__UINT32 expected_tcode,ON_UUID *expected_uuid)

{
  bool bVar1;
  ushort uVar2;
  ON__UINT32 OVar3;
  uchar *puVar4;
  byte *pbVar5;
  uchar *puVar6;
  byte *pbVar7;
  uchar *puVar8;
  byte *pbVar9;
  uchar *puVar10;
  uint uVar11;
  byte *pbVar12;
  long lVar13;
  uchar *puVar14;
  byte *pbVar15;
  ushort uVar16;
  ushort uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  byte *pbVar22;
  uchar (*pauVar23) [8];
  bool bVar24;
  ON_UUID uuid;
  ON__INT64 header_length;
  ON__INT64 chunk_value;
  ON_UUID_struct local_60;
  ulong local_50;
  ON_UUID_struct *local_48;
  ON__INT64 local_40;
  ulong local_38;
  
  puVar4 = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if (puVar4 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  local_38 = 0xffffffffffffffff;
  local_48 = expected_uuid;
  pbVar5 = BufferToChunkValue(bReverseByteOrder,sizeof_chunk_value,puVar4,buffer_end,
                              (ON__INT64 *)&local_38);
  if ((long)local_38 < 0 || pbVar5 == (byte *)0x0) {
    return (uchar *)0x0;
  }
  bVar24 = local_38 < sizeof_chunk_value + 0x31;
  if (local_38 != 0x14 && (bVar24 || expected_tcode != 0x20008080)) {
    return (uchar *)0x0;
  }
  if ((pbVar5 < buffer_end) && (0xf < (long)buffer_end - (long)pbVar5)) {
    pbVar9 = pbVar5 + 2;
    if (bReverseByteOrder) {
      pbVar7 = pbVar9;
      pbVar9 = pbVar5 + 1;
      pbVar12 = pbVar5 + 3;
      pbVar15 = pbVar5;
    }
    else {
      pbVar7 = pbVar5 + 1;
      pbVar15 = pbVar5 + 3;
      pbVar12 = pbVar5;
    }
    if ((long)buffer_end - (long)(pbVar5 + 4) < 2 || buffer_end <= pbVar5 + 4) {
      uVar2 = 0;
      uVar16 = 0;
      pbVar22 = (byte *)0x0;
    }
    else {
      uVar16 = (ushort)pbVar5[(ulong)bReverseByteOrder + 4];
      pbVar22 = pbVar5 + 6;
      uVar2 = (ushort)pbVar5[(ulong)!bReverseByteOrder + 4] << 8;
    }
    if ((pbVar22 == (byte *)0x0) || ((long)buffer_end - (long)pbVar22 < 2 || buffer_end <= pbVar22))
    {
      uVar17 = 0;
      uVar18 = 0;
      pauVar23 = (uchar (*) [8])0x0;
    }
    else {
      uVar18 = (ulong)pbVar22[bReverseByteOrder];
      pauVar23 = (uchar (*) [8])(pbVar22 + 2);
      uVar17 = (ushort)pbVar22[!bReverseByteOrder] << 8;
    }
    if ((pauVar23 == (uchar (*) [8])0x0) ||
       (local_50 = uVar18, (long)buffer_end - (long)pauVar23 < 8 || buffer_end <= pauVar23))
    goto LAB_003a3974;
    local_60.Data1 =
         (uint)CONCAT11(*pbVar7,*pbVar12) | (uint)*pbVar9 << 0x10 | (uint)*pbVar15 << 0x18;
    local_60.Data2 = uVar16 | uVar2;
    local_50._0_2_ = (ushort)uVar18;
    local_60.Data3 = (ushort)local_50 | uVar17;
    local_60.Data4 = *pauVar23;
    puVar4 = pauVar23[1];
  }
  else {
LAB_003a3974:
    puVar4 = (uchar *)0x0;
  }
  if (puVar4 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  if ((local_48 != (ON_UUID_struct *)0x0) && (bVar1 = operator!=(&local_60,local_48), bVar1)) {
    return (uchar *)0x0;
  }
  if (bVar24 || expected_tcode != 0x20008080) goto LAB_003a3a63;
  puVar4 = BufferValidateTcode(bReverseByteOrder,puVar4,buffer_end,0x20008082);
  if (puVar4 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  local_40 = -1;
  puVar4 = BufferToChunkValue(bReverseByteOrder,sizeof_chunk_value,puVar4,buffer_end,&local_40);
  if (puVar4 == (uchar *)0x0) {
    puVar4 = (uchar *)0x0;
LAB_003a3a59:
    bVar24 = false;
  }
  else {
    if (local_40 < 0x19) goto LAB_003a3a59;
    bVar1 = local_40 <= (long)buffer_end - (long)puVar4;
    bVar24 = bVar1 && puVar4 < buffer_end;
    lVar13 = 0;
    if (bVar1 && puVar4 < buffer_end) {
      lVar13 = local_40;
    }
    puVar4 = puVar4 + lVar13;
  }
  if (!bVar24) {
    return (uchar *)0x0;
  }
LAB_003a3a63:
  if ((long)buffer_end - (long)puVar4 < 4 || buffer_end <= puVar4) {
    uVar20 = 0;
    uVar21 = 0;
    uVar11 = 0;
    uVar19 = 0;
    puVar4 = (uchar *)0x0;
  }
  else {
    puVar10 = puVar4 + 2;
    if (bReverseByteOrder) {
      puVar6 = puVar10;
      puVar8 = puVar4;
      puVar10 = puVar4 + 1;
      puVar14 = puVar4 + 3;
    }
    else {
      puVar6 = puVar4 + 1;
      puVar8 = puVar4 + 3;
      puVar14 = puVar4;
    }
    uVar19 = (uint)*puVar14;
    puVar4 = puVar4 + 4;
    uVar20 = (uint)*puVar8 << 0x18;
    uVar21 = (uint)*puVar10 << 0x10;
    uVar11 = (uint)*puVar6 << 8;
  }
  if (puVar4 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  OVar3 = ON_CRC32(0,4,&local_60);
  OVar3 = ON_CRC32(OVar3,2,&local_60.Data2);
  OVar3 = ON_CRC32(OVar3,2,&local_60.Data3);
  OVar3 = ON_CRC32(OVar3,8,local_60.Data4);
  if ((uVar11 | uVar19 | uVar21 | uVar20) == OVar3) {
    return puVar4;
  }
  return (uchar *)0x0;
}

Assistant:

static
const unsigned char* EmergencyFindTable_UuidHelper( 
          bool bReverseByteOrder,
          size_t sizeof_chunk_value, 
          const unsigned char* buffer,
          const unsigned char* buffer_end,
          const ON__UINT32 expected_tcode,
          const ON_UUID* expected_uuid
          )
{
  ON__INT64 chunk_value;
  ON__UINT32 c, cc;
  ON_UUID uuid;

  // make sure the value at the start of the buffer = expected_tcode.
  buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if ( 0 == buffer )
    return 0;

  // get length of this chunk containing the uuid
  chunk_value = -1;
  buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&chunk_value );
  if ( 0 == buffer || chunk_value < 0 )
    return 0;

  // determine how long the chunk is supposed to be and validate the length.
  //
  // The "16+4+sizeof_chunk_value+21+4+4" in the bLookForUserTableRecordHeader
  // breaks down as:
  //  16                       sizeof(uuid)
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk typecode)
  //  +sizeof_chunk_value    + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk length)
  //  +21                    + major ver, minor ver, bool, archive ver, 3dm ver
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk crc)
  //  +4                     + sizeof(TCODE_USER_TABLE_UUID chunk crc)
  const bool bLookForUserTableRecordHeader = (TCODE_USER_TABLE_UUID == expected_tcode
                                              && ((ON__UINT64)chunk_value) >= (16+4+sizeof_chunk_value+21+4+4)
                                             );
  if ( !bLookForUserTableRecordHeader && 20 != chunk_value )
    return 0;
  buffer = BufferToUuid(bReverseByteOrder,buffer,buffer_end,uuid);
  if ( 0 == buffer )
    return 0;
  if( 0 != expected_uuid && uuid != *expected_uuid )
    return 0;
  
  if ( bLookForUserTableRecordHeader )
  {
    // make sure there is a TCODE_USER_TABLE_RECORD_HEADER chunk and skip over it.
    buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,TCODE_USER_TABLE_RECORD_HEADER);
    if ( 0 == buffer )
      return 0;
    // get length of the TCODE_USER_TABLE_RECORD_HEADER chunk
    ON__INT64 header_length = -1;
    buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&header_length );
    if ( 0 == buffer )
      return 0;
    if ( header_length < 25 )
      return 0;
    if ( buffer >= buffer_end || buffer_end - buffer < header_length )
      return 0;
    buffer += header_length;
  }

  buffer = BufferToUINT32(bReverseByteOrder,buffer,buffer_end,&c);
  if ( 0 == buffer )
    return 0;
  cc = ON_CRC32(0,4,&uuid.Data1);
  cc = ON_CRC32(cc,2,&uuid.Data2);
  cc = ON_CRC32(cc,2,&uuid.Data3);
  cc = ON_CRC32(cc,8,&uuid.Data4[0]);
  if ( c != cc )
    return 0;

  return buffer;
}